

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20>::TPZManVector
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20> *this,int64_t size)

{
  ulong uVar1;
  int64_t *piVar2;
  int64_t iVar3;
  ulong uVar4;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar5;
  long lVar6;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar7;
  
  lVar6 = 0;
  TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::TPZVec
            (&this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>,0);
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0165f8d0;
  pTVar5 = this->fExtAlloc;
  pTVar7 = pTVar5;
  do {
    TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(pTVar7);
    lVar6 = lVar6 + -8;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0xa0);
  if (size < 0x15) {
    iVar3 = 0;
  }
  else {
    uVar1 = size * 8;
    uVar4 = 0xffffffffffffffff;
    if (uVar1 < 0xfffffffffffffff8) {
      uVar4 = uVar1 + 8;
    }
    piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | uVar4);
    *piVar2 = size;
    pTVar5 = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar2 + 1);
    lVar6 = 0;
    pTVar7 = pTVar5;
    do {
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(pTVar7);
      lVar6 = lVar6 + -8;
      pTVar7 = pTVar7 + 1;
      iVar3 = size;
    } while (-lVar6 != uVar1);
  }
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore = pTVar5;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements = size;
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = iVar3;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}